

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

zt_ptr_array * zt_cstr_cut(char *str,int delim,int keep_delim)

{
  int iVar1;
  zt_ptr_array *array;
  char *__ptr;
  char *pcVar2;
  char *data;
  zt_ptr_array *pzVar3;
  
  array = zt_ptr_array_init((void *)0x0,free);
  pzVar3 = (zt_ptr_array *)0x0;
  if (array != (zt_ptr_array *)0x0) {
    __ptr = strdup(str);
    pcVar2 = __ptr;
    do {
      pcVar2 = strchr(pcVar2,delim);
      if ((pcVar2 == (char *)0x0) || (pcVar2[1] == '\0')) goto LAB_0010548b;
      pcVar2 = pcVar2 + 1;
      data = strdup(pcVar2 + -(ulong)(keep_delim != 0));
      iVar1 = zt_ptr_array_add(array,data);
    } while (-1 < iVar1);
    zt_ptr_array_free(array,1);
    array = (zt_ptr_array *)0x0;
LAB_0010548b:
    free(__ptr);
    pzVar3 = array;
  }
  return pzVar3;
}

Assistant:

zt_ptr_array *
zt_cstr_cut(const char *str, const int delim, int keep_delim) {
    char         *str_copy;
    char         *cut_tok;
    zt_ptr_array *cuts;

    if ((cuts = zt_ptr_array_init(NULL, free)) == NULL) {
        return NULL;
    }

    cut_tok    = str_copy = strdup(str);
    keep_delim = keep_delim ? 1 : 0;

    while ((cut_tok = strchr(cut_tok, delim))) {
        cut_tok++;

        if (*cut_tok == '\0') {
            break;
        }

        if (zt_ptr_array_add(cuts, (void *)strdup((char *)(cut_tok - keep_delim))) < 0) {
            zt_ptr_array_free(cuts, 1);
            free(str_copy);
            return NULL;
        }
    }

    free(str_copy);
    return cuts;
}